

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::Program::Program
          (Program *this,Functions *gl,char *vertexSource,char *fragmentSource)

{
  char *__s;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_119;
  string local_118;
  ProgramSources local_f8;
  char *local_28;
  char *fragmentSource_local;
  char *vertexSource_local;
  Functions *gl_local;
  Program *this_local;
  
  local_28 = fragmentSource;
  fragmentSource_local = vertexSource;
  vertexSource_local = (char *)gl;
  gl_local = (Functions *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,vertexSource,&local_119);
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,__s,&local_151);
  programSources(&local_f8,&local_118,&local_150);
  glu::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,gl,&local_f8);
  glu::ProgramSources::~ProgramSources(&local_f8);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

Program (const glw::Functions& gl, const char* vertexSource, const char* fragmentSource)
		: glu::ShaderProgram(gl, programSources(vertexSource, fragmentSource)) {}